

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O1

void compress_block(deflate_state *s,ct_data *ltree,ct_data *dtree)

{
  byte bVar1;
  Bytef BVar2;
  ulg uVar3;
  ulong uVar4;
  int iVar5;
  ushort uVar6;
  uint uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  
  if (s->last_lit != 0) {
    uVar4 = 0;
    do {
      uVar6 = s->d_buf[uVar4];
      bVar1 = s->l_buf[uVar4];
      if (uVar6 == 0) {
        uVar6 = ltree[bVar1].dl.dad;
        iVar5 = s->bi_valid;
        uVar10 = ltree[bVar1].fc.freq;
        uVar9 = uVar10 << ((byte)iVar5 & 0x1f);
        if ((int)(0x10 - (uint)uVar6) < iVar5) {
          uVar9 = uVar9 | s->bi_buf;
          s->bi_buf = uVar9;
          uVar3 = s->pending;
          s->pending = uVar3 + 1;
          s->pending_buf[uVar3] = (Bytef)uVar9;
          BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar3 = s->pending;
          s->pending = uVar3 + 1;
          s->pending_buf[uVar3] = BVar2;
          s->bi_buf = uVar10 >> (0x10U - (char)s->bi_valid & 0x1f);
          iVar5 = (uint)uVar6 + s->bi_valid + -0x10;
        }
        else {
          s->bi_buf = s->bi_buf | uVar9;
          iVar5 = iVar5 + (uint)uVar6;
        }
        s->bi_valid = iVar5;
      }
      else {
        uVar13 = (ulong)""[bVar1];
        uVar10 = ltree[uVar13 + 0x101].dl.dad;
        iVar5 = s->bi_valid;
        uVar9 = ltree[uVar13 + 0x101].fc.freq;
        uVar8 = uVar9 << ((byte)iVar5 & 0x1f);
        if ((int)(0x10 - (uint)uVar10) < iVar5) {
          uVar8 = uVar8 | s->bi_buf;
          s->bi_buf = uVar8;
          uVar3 = s->pending;
          s->pending = uVar3 + 1;
          s->pending_buf[uVar3] = (Bytef)uVar8;
          BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar3 = s->pending;
          s->pending = uVar3 + 1;
          s->pending_buf[uVar3] = BVar2;
          s->bi_buf = uVar9 >> (0x10U - (char)s->bi_valid & 0x1f);
          iVar5 = s->bi_valid + (uint)uVar10 + -0x10;
        }
        else {
          s->bi_buf = s->bi_buf | uVar8;
          iVar5 = iVar5 + (uint)uVar10;
        }
        s->bi_valid = iVar5;
        if (0xffffffffffffffeb < uVar13 - 0x1c) {
          uVar11 = (uint)bVar1 - base_length[uVar13];
          iVar12 = extra_lbits[uVar13];
          if (0x10 - iVar12 < iVar5) {
            uVar10 = (ushort)(uVar11 << ((byte)iVar5 & 0x1f)) | s->bi_buf;
            s->bi_buf = uVar10;
            uVar3 = s->pending;
            s->pending = uVar3 + 1;
            s->pending_buf[uVar3] = (Bytef)uVar10;
            BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
            uVar3 = s->pending;
            s->pending = uVar3 + 1;
            s->pending_buf[uVar3] = BVar2;
            s->bi_buf = (ush)((uVar11 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
            iVar12 = iVar12 + s->bi_valid + -0x10;
          }
          else {
            s->bi_buf = s->bi_buf | (ushort)(uVar11 << ((byte)iVar5 & 0x1f));
            iVar12 = iVar12 + iVar5;
          }
          s->bi_valid = iVar12;
        }
        uVar7 = uVar6 - 1;
        uVar11 = (uVar7 >> 7) + 0x100;
        if (uVar6 < 0x101) {
          uVar11 = uVar7;
        }
        bVar1 = ""[uVar11];
        uVar6 = dtree[bVar1].dl.dad;
        iVar5 = s->bi_valid;
        uVar10 = dtree[bVar1].fc.freq;
        uVar9 = uVar10 << ((byte)iVar5 & 0x1f);
        if ((int)(0x10 - (uint)uVar6) < iVar5) {
          uVar9 = uVar9 | s->bi_buf;
          s->bi_buf = uVar9;
          uVar3 = s->pending;
          s->pending = uVar3 + 1;
          s->pending_buf[uVar3] = (Bytef)uVar9;
          BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar3 = s->pending;
          s->pending = uVar3 + 1;
          s->pending_buf[uVar3] = BVar2;
          s->bi_buf = uVar10 >> (0x10U - (char)s->bi_valid & 0x1f);
          iVar5 = (uint)uVar6 + s->bi_valid + -0x10;
        }
        else {
          s->bi_buf = s->bi_buf | uVar9;
          iVar5 = iVar5 + (uint)uVar6;
        }
        s->bi_valid = iVar5;
        if (3 < bVar1) {
          uVar7 = uVar7 - base_dist[bVar1];
          iVar12 = extra_dbits[bVar1];
          if (0x10 - iVar12 < iVar5) {
            uVar6 = (ushort)(uVar7 << ((byte)iVar5 & 0x1f)) | s->bi_buf;
            s->bi_buf = uVar6;
            uVar3 = s->pending;
            s->pending = uVar3 + 1;
            s->pending_buf[uVar3] = (Bytef)uVar6;
            BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
            uVar3 = s->pending;
            s->pending = uVar3 + 1;
            s->pending_buf[uVar3] = BVar2;
            s->bi_buf = (ush)((uVar7 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
            iVar12 = iVar12 + s->bi_valid + -0x10;
          }
          else {
            s->bi_buf = s->bi_buf | (ushort)(uVar7 << ((byte)iVar5 & 0x1f));
            iVar12 = iVar12 + iVar5;
          }
          s->bi_valid = iVar12;
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < s->last_lit);
  }
  uVar6 = ltree[0x100].dl.dad;
  iVar5 = s->bi_valid;
  uVar10 = ltree[0x100].fc.freq;
  uVar9 = uVar10 << ((byte)iVar5 & 0x1f) | s->bi_buf;
  s->bi_buf = uVar9;
  if ((int)(0x10 - (uint)uVar6) < iVar5) {
    uVar3 = s->pending;
    s->pending = uVar3 + 1;
    s->pending_buf[uVar3] = (Bytef)uVar9;
    BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
    uVar3 = s->pending;
    s->pending = uVar3 + 1;
    s->pending_buf[uVar3] = BVar2;
    s->bi_buf = uVar10 >> (0x10U - (char)s->bi_valid & 0x1f);
    iVar5 = (uint)uVar6 + s->bi_valid + -0x10;
  }
  else {
    iVar5 = iVar5 + (uint)uVar6;
  }
  s->bi_valid = iVar5;
  return;
}

Assistant:

local void compress_block(s, ltree, dtree)
    deflate_state *s;
    const ct_data *ltree; /* literal tree */
    const ct_data *dtree; /* distance tree */
{
    unsigned dist;      /* distance of matched string */
    int lc;             /* match length or unmatched char (if dist == 0) */
    unsigned lx = 0;    /* running index in l_buf */
    unsigned code;      /* the code to send */
    int extra;          /* number of extra bits to send */

    if (s->last_lit != 0) do {
        dist = s->d_buf[lx];
        lc = s->l_buf[lx++];
        if (dist == 0) {
            send_code(s, lc, ltree); /* send a literal byte */
            Tracecv(isgraph(lc), (stderr," '%c' ", lc));
        } else {
            /* Here, lc is the match length - MIN_MATCH */
            code = _length_code[lc];
            send_code(s, code+LITERALS+1, ltree); /* send the length code */
            extra = extra_lbits[code];
            if (extra != 0) {
                lc -= base_length[code];
                send_bits(s, lc, extra);       /* send the extra length bits */
            }
            dist--; /* dist is now the match distance - 1 */
            code = d_code(dist);
            Assert (code < D_CODES, "bad d_code");

            send_code(s, code, dtree);       /* send the distance code */
            extra = extra_dbits[code];
            if (extra != 0) {
                dist -= (unsigned)base_dist[code];
                send_bits(s, dist, extra);   /* send the extra distance bits */
            }
        } /* literal or match pair ? */

        /* Check that the overlay between pending_buf and d_buf+l_buf is ok: */
        Assert((uInt)(s->pending) < s->lit_bufsize + 2*lx,
               "pendingBuf overflow");

    } while (lx < s->last_lit);

    send_code(s, END_BLOCK, ltree);
}